

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator __thiscall
QHash<QObject_const*,QList<QCss::StyleRule>>::emplace_helper<QList<QCss::StyleRule>>
          (QHash<QObject_const*,QList<QCss::StyleRule>> *this,QObject **key,
          QList<QCss::StyleRule> *args)

{
  Data *pDVar1;
  StyleRule *pSVar2;
  qsizetype qVar3;
  piter pVar4;
  Node<QObject_const*,QList<QCss::StyleRule>> *this_00;
  long in_FS_OFFSET;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<QObject_const*,QList<QCss::StyleRule>>>::
  findOrInsert<QObject_const*>
            ((InsertionResult *)local_38,
             *(Data<QHashPrivate::Node<QObject_const*,QList<QCss::StyleRule>>> **)this,key);
  this_00 = (Node<QObject_const*,QList<QCss::StyleRule>> *)
            ((*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].entries +
            (*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].offsets
            [(uint)local_38._8_8_ & 0x7f]);
  if (local_38[0x10] == false) {
    *(QObject **)this_00 = *key;
    pDVar1 = (args->d).d;
    (args->d).d = (Data *)0x0;
    *(Data **)(this_00 + 8) = pDVar1;
    pSVar2 = (args->d).ptr;
    (args->d).ptr = (StyleRule *)0x0;
    *(StyleRule **)(this_00 + 0x10) = pSVar2;
    qVar3 = (args->d).size;
    (args->d).size = 0;
    *(qsizetype *)(this_00 + 0x18) = qVar3;
  }
  else {
    QHashPrivate::Node<QObject_const*,QList<QCss::StyleRule>>::emplaceValue<QList<QCss::StyleRule>>
              (this_00,args);
  }
  pVar4.bucket = local_38._8_8_;
  pVar4.d = (Data<QHashPrivate::Node<const_QObject_*,_QList<QCss::StyleRule>_>_> *)local_38._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar4;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }